

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::DumpScopes(FunctionBody *this)

{
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  if ((this->m_sourceInfo).pScopeObjectChain.ptr != (ScopeObjectChain *)0x0) {
    iVar2 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Print(L"%s (%s) :\n",CONCAT44(extraout_var,iVar2),(wchar (*) [42])local_78);
    pLVar1 = (((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr;
    if (0 < (pLVar1->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
            count) {
      lVar3 = 0;
      do {
        DebuggerScope::Dump((pLVar1->
                            super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                            ).buffer.ptr[lVar3].ptr);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (pLVar1->
                       super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
                       count);
    }
  }
  return;
}

Assistant:

void FunctionBody::DumpScopes()
    {
        if(this->GetScopeObjectChain())
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("%s (%s) :\n"), this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
            this->GetScopeObjectChain()->pScopeChain->Map( [=] (uint index, DebuggerScope* scope )
            {
                scope->Dump();
            });
        }
    }